

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

int av1_get_sbq_variance_boost(AV1_COMP *cpi,MACROBLOCK *x)

{
  int qindex;
  aom_bit_depth_t bit_depth;
  uint uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  qindex = (cpi->common).quant_params.base_qindex;
  bit_depth = ((cpi->common).seq_params)->bit_depth;
  uVar1 = av1_get_variance_boost_block_variance(cpi,x);
  dVar4 = log2((double)(uVar1 + (uVar1 == 0)));
  dVar6 = (10.0 - dVar4) * 0.44999999999999996 + 1.0;
  dVar4 = 8.0;
  if (dVar6 <= 8.0) {
    dVar4 = dVar6;
  }
  dVar5 = av1_convert_qindex_to_q(qindex,bit_depth);
  iVar2 = av1_convert_q_to_qindex
                    (dVar5 / (double)(-(ulong)(dVar6 < 1.0) & 0x3ff0000000000000 |
                                     ~-(ulong)(dVar6 < 1.0) & (ulong)dVar4),bit_depth);
  dVar4 = round(((double)(qindex - iVar2) * ((double)qindex + 544.0)) / 1279.0);
  iVar2 = 0x50;
  if ((int)dVar4 < 0x50) {
    iVar2 = (int)dVar4;
  }
  iVar3 = 1;
  if (1 < qindex - iVar2) {
    iVar3 = qindex - iVar2;
  }
  return iVar3;
}

Assistant:

int av1_get_sbq_variance_boost(const AV1_COMP *cpi, const MACROBLOCK *x) {
  const AV1_COMMON *cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;

  // Variance Boost only supports 64x64 SBs.
  assert(cm->seq_params->sb_size == BLOCK_64X64);

  // Strength is currently hard-coded and optimized for still pictures. In the
  // future, we might want to expose this as a parameter that can be fine-tuned
  // by the caller.
  const int strength = 3;
  unsigned int variance = av1_get_variance_boost_block_variance(cpi, x);

  // Variance = 0 areas are either completely flat patches or have very fine
  // gradients. Boost these blocks as if they have a variance of 1.
  if (variance == 0) {
    variance = 1;
  }

  // Compute a boost based on a fast-growing formula.
  // High and medium variance SBs essentially get no boost, while lower variance
  // SBs get increasingly stronger boosts.
  assert(strength >= 1 && strength <= 4);

  // Still picture curve, with variance crossover point at 1024.
  double qstep_ratio = 0.15 * strength * (-log2((double)variance) + 10.0) + 1.0;
  qstep_ratio = fclamp(qstep_ratio, 1.0, VAR_BOOST_MAX_BOOST);

  double base_q = av1_convert_qindex_to_q(base_qindex, bit_depth);
  double target_q = base_q / qstep_ratio;
  int target_qindex = av1_convert_q_to_qindex(target_q, bit_depth);

  // Determine the SB's delta_q boost by computing an (unscaled) delta_q from
  // the base and target q values, then scale that delta_q according to the
  // frame's base qindex.
  // The scaling coefficients were chosen empirically to maximize SSIMULACRA 2
  // scores, 10th percentile scores, and subjective quality. Boosts become
  // smaller (for a given variance) the lower the base qindex.
  int boost = (int)round((base_qindex + 544.0) * (base_qindex - target_qindex) /
                         1279.0);
  boost = AOMMIN(VAR_BOOST_MAX_DELTAQ_RANGE, boost);

  // Variance Boost was designed to always operate in the lossy domain, so MINQ
  // is excluded.
  int sb_qindex = AOMMAX(base_qindex - boost, MINQ + 1);

  return sb_qindex;
}